

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_crld.cc
# Opt level: O2

int DIST_POINT_set_dpname(DIST_POINT_NAME *dpn,X509_NAME *iname)

{
  OPENSSL_STACK *sk;
  int iVar1;
  X509_NAME *pXVar2;
  size_t sVar3;
  X509_NAME_ENTRY *ne;
  ulong i;
  
  iVar1 = 1;
  if ((dpn != (DIST_POINT_NAME *)0x0) && (dpn->type == 1)) {
    sk = (OPENSSL_STACK *)(dpn->name).fullname;
    pXVar2 = X509_NAME_dup(iname);
    dpn->dpname = pXVar2;
    if (pXVar2 != (X509_NAME *)0x0) {
      i = 0;
      do {
        sVar3 = OPENSSL_sk_num(sk);
        if (sVar3 <= i) {
          iVar1 = i2d_X509_NAME(dpn->dpname,(uchar **)0x0);
          if (-1 < iVar1) {
            return 1;
          }
          break;
        }
        ne = (X509_NAME_ENTRY *)OPENSSL_sk_value(sk,i);
        iVar1 = X509_NAME_add_entry(dpn->dpname,ne,-1,(uint)(i == 0));
        i = i + 1;
      } while (iVar1 != 0);
      X509_NAME_free(dpn->dpname);
      dpn->dpname = (X509_NAME *)0x0;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int DIST_POINT_set_dpname(DIST_POINT_NAME *dpn, X509_NAME *iname) {
  size_t i;
  STACK_OF(X509_NAME_ENTRY) *frag;
  X509_NAME_ENTRY *ne;
  if (!dpn || (dpn->type != 1)) {
    return 1;
  }
  frag = dpn->name.relativename;
  dpn->dpname = X509_NAME_dup(iname);
  if (!dpn->dpname) {
    return 0;
  }
  for (i = 0; i < sk_X509_NAME_ENTRY_num(frag); i++) {
    ne = sk_X509_NAME_ENTRY_value(frag, i);
    if (!X509_NAME_add_entry(dpn->dpname, ne, -1, i ? 0 : 1)) {
      X509_NAME_free(dpn->dpname);
      dpn->dpname = NULL;
      return 0;
    }
  }
  // generate cached encoding of name
  if (i2d_X509_NAME(dpn->dpname, NULL) < 0) {
    X509_NAME_free(dpn->dpname);
    dpn->dpname = NULL;
    return 0;
  }
  return 1;
}